

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O2

int Curl_getaddrinfo_ex(char *nodename,char *servname,addrinfo *hints,Curl_addrinfo **result)

{
  addrinfo *paVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  Curl_addrinfo *pCVar6;
  size_t __n;
  Curl_addrinfo *pCVar7;
  Curl_addrinfo *cahead;
  Curl_addrinfo *pCVar8;
  char *__dest;
  addrinfo **__pai;
  addrinfo *aihead;
  
  *result = (Curl_addrinfo *)0x0;
  __pai = (addrinfo **)&aihead;
  iVar4 = getaddrinfo(nodename,servname,(addrinfo *)hints,__pai);
  if (iVar4 == 0) {
    cahead = (Curl_addrinfo *)0x0;
    pCVar8 = (Curl_addrinfo *)0x0;
    while( true ) {
      iVar4 = 0;
      paVar1 = *__pai;
      if (paVar1 == (addrinfo *)0x0) break;
      if (paVar1->ai_canonname == (char *)0x0) {
        sVar5 = 0;
      }
      else {
        sVar5 = strlen(paVar1->ai_canonname);
        sVar5 = sVar5 + 1;
      }
      __n = 0x10;
      pCVar7 = cahead;
      pCVar6 = pCVar8;
      if (paVar1->ai_family == 2) {
LAB_00532642:
        if ((paVar1->ai_addr != (sockaddr *)0x0) && ((uint)__n <= paVar1->ai_addrlen)) {
          pCVar6 = (Curl_addrinfo *)(*Curl_cmalloc)(__n + sVar5 + 0x30);
          if (pCVar6 == (Curl_addrinfo *)0x0) {
            iVar4 = -10;
            break;
          }
          iVar4 = paVar1->ai_family;
          iVar2 = paVar1->ai_socktype;
          iVar3 = paVar1->ai_protocol;
          pCVar6->ai_flags = paVar1->ai_flags;
          pCVar6->ai_family = iVar4;
          pCVar6->ai_socktype = iVar2;
          pCVar6->ai_protocol = iVar3;
          pCVar6->ai_addrlen = (uint)__n;
          pCVar6->ai_next = (Curl_addrinfo *)0x0;
          pCVar7 = pCVar6 + 1;
          pCVar6->ai_canonname = (char *)0x0;
          pCVar6->ai_addr = (sockaddr *)0x0;
          pCVar6->ai_addr = (sockaddr *)pCVar7;
          memcpy(pCVar7,paVar1->ai_addr,__n);
          if (sVar5 != 0) {
            __dest = (char *)((long)&pCVar7->ai_flags + __n);
            pCVar6->ai_canonname = __dest;
            memcpy(__dest,paVar1->ai_canonname,sVar5);
          }
          pCVar7 = pCVar6;
          if (cahead != (Curl_addrinfo *)0x0) {
            pCVar7 = cahead;
          }
          if (pCVar8 != (Curl_addrinfo *)0x0) {
            pCVar8->ai_next = pCVar6;
          }
        }
      }
      else if (paVar1->ai_family == 10) {
        __n = 0x1c;
        goto LAB_00532642;
      }
      __pai = &paVar1->ai_next;
      cahead = pCVar7;
      pCVar8 = pCVar6;
    }
    if (aihead != (addrinfo *)0x0) {
      freeaddrinfo((addrinfo *)aihead);
    }
    if (paVar1 == (addrinfo *)0x0) {
      iVar4 = (uint)(cahead != (Curl_addrinfo *)0x0) * 2 + -2;
    }
    else {
      Curl_freeaddrinfo(cahead);
      cahead = (Curl_addrinfo *)0x0;
    }
    *result = cahead;
  }
  return iVar4;
}

Assistant:

int
Curl_getaddrinfo_ex(const char *nodename,
                    const char *servname,
                    const struct addrinfo *hints,
                    struct Curl_addrinfo **result)
{
  const struct addrinfo *ai;
  struct addrinfo *aihead;
  struct Curl_addrinfo *cafirst = NULL;
  struct Curl_addrinfo *calast = NULL;
  struct Curl_addrinfo *ca;
  size_t ss_size;
  int error;

  *result = NULL; /* assume failure */

  error = getaddrinfo(nodename, servname, hints, &aihead);
  if(error)
    return error;

  /* traverse the addrinfo list */

  for(ai = aihead; ai != NULL; ai = ai->ai_next) {
    size_t namelen = ai->ai_canonname ? strlen(ai->ai_canonname) + 1 : 0;
    /* ignore elements with unsupported address family, */
    /* settle family-specific sockaddr structure size.  */
    if(ai->ai_family == AF_INET)
      ss_size = sizeof(struct sockaddr_in);
#ifdef ENABLE_IPV6
    else if(ai->ai_family == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
#endif
    else
      continue;

    /* ignore elements without required address info */
    if(!ai->ai_addr || !(ai->ai_addrlen > 0))
      continue;

    /* ignore elements with bogus address size */
    if((size_t)ai->ai_addrlen < ss_size)
      continue;

    ca = malloc(sizeof(struct Curl_addrinfo) + ss_size + namelen);
    if(!ca) {
      error = EAI_MEMORY;
      break;
    }

    /* copy each structure member individually, member ordering, */
    /* size, or padding might be different for each platform.    */

    ca->ai_flags     = ai->ai_flags;
    ca->ai_family    = ai->ai_family;
    ca->ai_socktype  = ai->ai_socktype;
    ca->ai_protocol  = ai->ai_protocol;
    ca->ai_addrlen   = (curl_socklen_t)ss_size;
    ca->ai_addr      = NULL;
    ca->ai_canonname = NULL;
    ca->ai_next      = NULL;

    ca->ai_addr = (void *)((char *)ca + sizeof(struct Curl_addrinfo));
    memcpy(ca->ai_addr, ai->ai_addr, ss_size);

    if(namelen) {
      ca->ai_canonname = (void *)((char *)ca->ai_addr + ss_size);
      memcpy(ca->ai_canonname, ai->ai_canonname, namelen);
    }

    /* if the return list is empty, this becomes the first element */
    if(!cafirst)
      cafirst = ca;

    /* add this element last in the return list */
    if(calast)
      calast->ai_next = ca;
    calast = ca;

  }

  /* destroy the addrinfo list */
  if(aihead)
    freeaddrinfo(aihead);

  /* if we failed, also destroy the Curl_addrinfo list */
  if(error) {
    Curl_freeaddrinfo(cafirst);
    cafirst = NULL;
  }
  else if(!cafirst) {
#ifdef EAI_NONAME
    /* rfc3493 conformant */
    error = EAI_NONAME;
#else
    /* rfc3493 obsoleted */
    error = EAI_NODATA;
#endif
#ifdef USE_WINSOCK
    SET_SOCKERRNO(error);
#endif
  }

  *result = cafirst;

  /* This is not a CURLcode */
  return error;
}